

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

bool __thiscall
FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>
::hasFastAccess(FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>
                *this)

{
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar1;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar2;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  *pFVar3;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  *pFVar4;
  
  pFVar1 = (this->left_->fadexpr_).left_;
  pFVar2 = (pFVar1->fadexpr_).left_;
  if (((*(int *)((long)(pFVar2->fadexpr_).left_ + 8) != 0) &&
      ((((pFVar2->fadexpr_).right_)->dx_).num_elts != 0)) &&
     ((((pFVar1->fadexpr_).right_)->dx_).num_elts != 0)) {
    pFVar3 = (this->right_->fadexpr_).left_;
    pFVar4 = (pFVar3->fadexpr_).left_;
    if ((((*(Fad<double> **)((long)&((pFVar4->fadexpr_).left_)->fadexpr_ + 0x10))->dx_).num_elts !=
         0) && ((((((pFVar4->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts != 0)) {
      return (((((pFVar3->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts != 0;
    }
  }
  return false;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}